

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_pack16.h
# Opt level: O3

void ncnn::conv3x3s1_winograd63_transform_kernel_pack16_avx512
               (Mat *kernel,Mat *kernel_tm_pack16,int inch,int outch,Option *opt)

{
  undefined4 uVar1;
  uint uVar2;
  undefined8 uVar3;
  void *pvVar4;
  size_t sVar5;
  size_t sVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  int *piVar12;
  undefined1 auVar13 [64];
  long lVar14;
  long lVar15;
  undefined4 *puVar16;
  int iVar17;
  long lVar18;
  undefined8 *puVar19;
  ulong uVar20;
  long lVar21;
  int iVar22;
  void *pvVar23;
  ulong uVar24;
  undefined4 *puVar25;
  void *pvVar26;
  undefined4 *puVar27;
  int i;
  long lVar28;
  undefined4 *puVar29;
  void *pvVar30;
  int j;
  long lVar31;
  long lVar32;
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [64];
  undefined1 auVar45 [16];
  float tmp [8] [3];
  Mat local_e8;
  undefined1 local_98 [64];
  undefined1 local_58 [32];
  
  local_e8.cstep = 0;
  local_e8.data = (void *)0x0;
  local_e8.refcount._0_4_ = 0;
  local_e8.refcount._4_4_ = 0;
  local_e8.elemsize._0_4_ = 0;
  local_e8.elemsize._4_4_ = 0;
  local_e8.elempack = 0;
  local_e8.allocator = (Allocator *)0x0;
  local_e8.dims = 0;
  local_e8.w = 0;
  local_e8.h = 0;
  local_e8.d = 0;
  local_e8.c = 0;
  Mat::create(&local_e8,0x40,inch,outch,4,(Allocator *)0x0);
  auVar13 = _DAT_00516c40;
  if (0 < outch) {
    pvVar4 = kernel->data;
    auVar36 = vpermi2ps_avx512f(ZEXT3264(_DAT_00517d20),_DAT_00517580,_DAT_005175c0);
    auVar37 = vpermi2ps_avx512f(ZEXT3264(_DAT_00517d40),_DAT_00517580,_DAT_005175c0);
    auVar38 = vpermi2ps_avx512f(ZEXT3264(_DAT_00517d60),_DAT_00517580,_DAT_005175c0);
    uVar24 = 0;
    auVar44 = ZEXT3264(_DAT_00517d80);
    pvVar30 = local_e8.data;
    do {
      if (0 < inch) {
        iVar22 = inch * 9 * (int)uVar24;
        uVar20 = 0;
        pvVar23 = pvVar30;
        do {
          uVar1 = *(undefined4 *)((long)pvVar4 + uVar20 * 0x24 + (long)iVar22 * 4);
          auVar33._4_4_ = uVar1;
          auVar33._0_4_ = uVar1;
          auVar33._8_4_ = uVar1;
          auVar33._12_4_ = uVar1;
          auVar33._16_4_ = uVar1;
          auVar33._20_4_ = uVar1;
          auVar33._24_4_ = uVar1;
          auVar33._28_4_ = uVar1;
          auVar41 = auVar36._0_32_;
          auVar33 = vmulps_avx512vl(auVar41,auVar33);
          uVar1 = *(undefined4 *)((long)pvVar4 + uVar20 * 0x24 + (long)iVar22 * 4 + 4);
          auVar34._4_4_ = uVar1;
          auVar34._0_4_ = uVar1;
          auVar34._8_4_ = uVar1;
          auVar34._12_4_ = uVar1;
          auVar34._16_4_ = uVar1;
          auVar34._20_4_ = uVar1;
          auVar34._24_4_ = uVar1;
          auVar34._28_4_ = uVar1;
          auVar42 = auVar37._0_32_;
          auVar33 = vfmadd231ps_avx512vl(auVar33,auVar42,auVar34);
          uVar1 = *(undefined4 *)((long)pvVar4 + uVar20 * 0x24 + (long)iVar22 * 4 + 8);
          auVar35._4_4_ = uVar1;
          auVar35._0_4_ = uVar1;
          auVar35._8_4_ = uVar1;
          auVar35._12_4_ = uVar1;
          auVar35._16_4_ = uVar1;
          auVar35._20_4_ = uVar1;
          auVar35._24_4_ = uVar1;
          auVar35._28_4_ = uVar1;
          auVar43 = auVar38._0_32_;
          auVar33 = vfmadd231ps_avx512vl(auVar33,auVar43,auVar35);
          uVar1 = *(undefined4 *)((long)pvVar4 + uVar20 * 0x24 + (long)iVar22 * 4 + 0xc);
          auVar8._4_4_ = uVar1;
          auVar8._0_4_ = uVar1;
          auVar8._8_4_ = uVar1;
          auVar8._12_4_ = uVar1;
          auVar8._16_4_ = uVar1;
          auVar8._20_4_ = uVar1;
          auVar8._24_4_ = uVar1;
          auVar8._28_4_ = uVar1;
          auVar34 = vmulps_avx512vl(auVar41,auVar8);
          uVar1 = *(undefined4 *)((long)pvVar4 + uVar20 * 0x24 + (long)iVar22 * 4 + 0x10);
          auVar9._4_4_ = uVar1;
          auVar9._0_4_ = uVar1;
          auVar9._8_4_ = uVar1;
          auVar9._12_4_ = uVar1;
          auVar9._16_4_ = uVar1;
          auVar9._20_4_ = uVar1;
          auVar9._24_4_ = uVar1;
          auVar9._28_4_ = uVar1;
          auVar34 = vfmadd231ps_avx512vl(auVar34,auVar42,auVar9);
          uVar1 = *(undefined4 *)((long)pvVar4 + uVar20 * 0x24 + (long)iVar22 * 4 + 0x14);
          auVar10._4_4_ = uVar1;
          auVar10._0_4_ = uVar1;
          auVar10._8_4_ = uVar1;
          auVar10._12_4_ = uVar1;
          auVar10._16_4_ = uVar1;
          auVar10._20_4_ = uVar1;
          auVar10._24_4_ = uVar1;
          auVar10._28_4_ = uVar1;
          auVar34 = vfmadd231ps_avx512vl(auVar34,auVar43,auVar10);
          uVar1 = *(undefined4 *)((long)pvVar4 + uVar20 * 0x24 + (long)iVar22 * 4 + 0x18);
          auVar11._4_4_ = uVar1;
          auVar11._0_4_ = uVar1;
          auVar11._8_4_ = uVar1;
          auVar11._12_4_ = uVar1;
          auVar11._16_4_ = uVar1;
          auVar11._20_4_ = uVar1;
          auVar11._24_4_ = uVar1;
          auVar11._28_4_ = uVar1;
          auVar35 = vmulps_avx512vl(auVar41,auVar11);
          uVar1 = *(undefined4 *)((long)pvVar4 + uVar20 * 0x24 + (long)iVar22 * 4 + 0x1c);
          auVar41._4_4_ = uVar1;
          auVar41._0_4_ = uVar1;
          auVar41._8_4_ = uVar1;
          auVar41._12_4_ = uVar1;
          auVar41._16_4_ = uVar1;
          auVar41._20_4_ = uVar1;
          auVar41._24_4_ = uVar1;
          auVar41._28_4_ = uVar1;
          auVar35 = vfmadd231ps_avx512vl(auVar35,auVar42,auVar41);
          uVar1 = *(undefined4 *)((long)pvVar4 + uVar20 * 0x24 + (long)iVar22 * 4 + 0x20);
          auVar42._4_4_ = uVar1;
          auVar42._0_4_ = uVar1;
          auVar42._8_4_ = uVar1;
          auVar42._12_4_ = uVar1;
          auVar42._16_4_ = uVar1;
          auVar42._20_4_ = uVar1;
          auVar42._24_4_ = uVar1;
          auVar42._28_4_ = uVar1;
          auVar35 = vfmadd231ps_avx512vl(auVar35,auVar43,auVar42);
          auVar39 = vinsertf64x4_avx512f(ZEXT3264(auVar33),auVar34,1);
          auVar40 = vpermt2ps_avx512f(auVar39,auVar44,ZEXT3264(auVar35));
          local_98 = vpermt2ps_avx512f(auVar39,auVar13,ZEXT3264(auVar35));
          local_58 = auVar40._0_32_;
          lVar31 = 0;
          pvVar26 = pvVar23;
          do {
            uVar2 = *(uint *)(local_98 + lVar31 * 0xc);
            uVar3 = *(undefined8 *)(local_98 + lVar31 * 0xc + 4);
            puVar19 = &DAT_00517584;
            lVar28 = 0;
            do {
              auVar45._0_4_ = (float)*puVar19 * (float)uVar3;
              auVar45._4_4_ = (float)((ulong)*puVar19 >> 0x20) * (float)((ulong)uVar3 >> 0x20);
              auVar45._8_8_ = 0;
              auVar7 = vfmadd132ss_fma(ZEXT416(*(uint *)((long)puVar19 + -4)),auVar45,ZEXT416(uVar2)
                                      );
              auVar45 = vmovshdup_avx(auVar45);
              *(float *)((long)pvVar26 + lVar28 * 4) = auVar7._0_4_ + auVar45._0_4_;
              lVar28 = lVar28 + 1;
              puVar19 = (undefined8 *)((long)puVar19 + 0xc);
            } while (lVar28 != 8);
            lVar31 = lVar31 + 1;
            pvVar26 = (void *)((long)pvVar26 + 0x20);
          } while (lVar31 != 8);
          uVar20 = uVar20 + 1;
          pvVar23 = (void *)((long)pvVar23 +
                            (long)local_e8.w *
                            CONCAT44(local_e8.elemsize._4_4_,(undefined4)local_e8.elemsize));
        } while (uVar20 != (uint)inch);
      }
      uVar24 = uVar24 + 1;
      pvVar30 = (void *)((long)pvVar30 +
                        local_e8.cstep *
                        CONCAT44(local_e8.elemsize._4_4_,(undefined4)local_e8.elemsize));
    } while (uVar24 != (uint)outch);
  }
  iVar22 = inch + 0xf;
  if (-1 < inch) {
    iVar22 = inch;
  }
  iVar17 = outch + 0xf;
  if (-1 < outch) {
    iVar17 = outch;
  }
  Mat::create(kernel_tm_pack16,iVar22 >> 4,0x40,iVar17 >> 4,0x400,0x100,(Allocator *)0x0);
  if (0xf < outch) {
    iVar22 = kernel_tm_pack16->w;
    pvVar4 = kernel_tm_pack16->data;
    sVar5 = kernel_tm_pack16->elemsize;
    sVar6 = kernel_tm_pack16->cstep;
    uVar24 = 0;
    do {
      lVar28 = local_e8.cstep * CONCAT44(local_e8.elemsize._4_4_,(undefined4)local_e8.elemsize);
      puVar29 = (undefined4 *)(lVar28 * uVar24 + (long)local_e8.data);
      lVar31 = (long)local_e8.w * CONCAT44(local_e8.elemsize._4_4_,(undefined4)local_e8.elemsize);
      lVar32 = 0;
      do {
        if (0xf < inch) {
          lVar14 = (long)pvVar4 + (long)iVar22 * sVar5 * lVar32 + (uVar24 >> 4) * sVar6 * sVar5;
          lVar21 = 0;
          puVar25 = puVar29;
          do {
            lVar18 = 0;
            puVar27 = puVar25;
            do {
              lVar15 = lVar14;
              lVar14 = 0;
              puVar16 = puVar27;
              do {
                *(undefined4 *)(lVar15 + lVar14) = *puVar16;
                puVar16 = (undefined4 *)((long)puVar16 + lVar28);
                lVar14 = lVar14 + 4;
              } while (lVar14 != 0x40);
              lVar18 = lVar18 + 1;
              puVar27 = (undefined4 *)((long)puVar27 + lVar31);
              lVar14 = lVar15 + 0x40;
            } while (lVar18 != 0x10);
            lVar18 = lVar21 + 0x1f;
            puVar25 = puVar25 + lVar31 * 4;
            lVar14 = lVar15 + 0x40;
            lVar21 = lVar21 + 0x10;
          } while (lVar18 < inch);
        }
        lVar32 = lVar32 + 1;
        puVar29 = puVar29 + 1;
      } while (lVar32 != 0x40);
      uVar20 = uVar24 + 0x1f;
      uVar24 = uVar24 + 0x10;
    } while (uVar20 < (uint)outch);
  }
  piVar12 = (int *)CONCAT44(local_e8.refcount._4_4_,local_e8.refcount._0_4_);
  if (piVar12 != (int *)0x0) {
    LOCK();
    *piVar12 = *piVar12 + -1;
    UNLOCK();
    if (*piVar12 == 0) {
      if (local_e8.allocator == (Allocator *)0x0) {
        if (local_e8.data != (void *)0x0) {
          free(local_e8.data);
        }
      }
      else {
        (*(local_e8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

static void conv3x3s1_winograd63_transform_kernel_pack16_avx512(const Mat& kernel, Mat& kernel_tm_pack16, int inch, int outch, const Option& opt)
{
    // winograd63 transform kernel
    Mat kernel_tm;
    kernel_tm.create(8 * 8, inch, outch);

    const float ktm[8][3] = {
        {1.0f, 0.0f, 0.0f},
        {-2.0f / 9, -2.0f / 9, -2.0f / 9},
        {-2.0f / 9, 2.0f / 9, -2.0f / 9},
        {1.0f / 90, 1.0f / 45, 2.0f / 45},
        {1.0f / 90, -1.0f / 45, 2.0f / 45},
        {1.0f / 45, 1.0f / 90, 1.0f / 180},
        {1.0f / 45, -1.0f / 90, 1.0f / 180},
        {0.0f, 0.0f, 1.0f}
    };

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        for (int q = 0; q < inch; q++)
        {
            const float* kernel0 = (const float*)kernel + p * inch * 9 + q * 9;
            float* kernel_tm0 = kernel_tm.channel(p).row(q);

            // transform kernel, transposed
            const float* k0 = kernel0;
            const float* k1 = kernel0 + 3;
            const float* k2 = kernel0 + 6;

            // h
            float tmp[8][3];
            for (int i = 0; i < 8; i++)
            {
                tmp[i][0] = k0[0] * ktm[i][0] + k0[1] * ktm[i][1] + k0[2] * ktm[i][2];
                tmp[i][1] = k1[0] * ktm[i][0] + k1[1] * ktm[i][1] + k1[2] * ktm[i][2];
                tmp[i][2] = k2[0] * ktm[i][0] + k2[1] * ktm[i][1] + k2[2] * ktm[i][2];
            }

            // v
            for (int j = 0; j < 8; j++)
            {
                float* tmpp = &tmp[j][0];

                for (int i = 0; i < 8; i++)
                {
                    kernel_tm0[j * 8 + i] = tmpp[0] * ktm[i][0] + tmpp[1] * ktm[i][1] + tmpp[2] * ktm[i][2];
                }
            }
        }
    }
    // interleave
    // src = 64-inch-outch
    // dst = 16b-16a-inch/16a-64-outch/16b
    kernel_tm_pack16.create(inch / 16, 64, outch / 16, (size_t)4u * 16 * 16, 16 * 16);
    for (int q = 0; q + 15 < outch; q += 16)
    {
        Mat g0 = kernel_tm_pack16.channel(q / 16);

        for (int k = 0; k < 64; k++)
        {
            float* g00 = g0.row(k);

            for (int p = 0; p + 15 < inch; p += 16)
            {
                for (int i = 0; i < 16; i++)
                {
                    for (int j = 0; j < 16; j++)
                    {
                        const float* k00 = kernel_tm.channel(q + j).row(p + i);
                        g00[0] = k00[k];
                        g00++;
                    }
                }
            }
        }
    }
}